

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O2

int google::protobuf::compiler::java::GetExperimentalJavaFieldType(FieldDescriptor *field)

{
  bool bVar1;
  Type TVar2;
  JavaType JVar3;
  int iVar4;
  Descriptor *pDVar5;
  FieldDescriptor *field_00;
  uint uVar6;
  uint uVar7;
  allocator local_39;
  string local_38;
  
  uVar6 = (uint)(((byte)field[1] & 0x60) == 0x40) * 0x100;
  TVar2 = FieldDescriptor::type(field);
  uVar7 = uVar6;
  if (TVar2 == TYPE_STRING) {
    if (*(char *)(*(long *)(field + 0x10) + 0x3a) == '\x03') {
      uVar7 = uVar6 | 0x200;
    }
    else {
      uVar7 = uVar6 + 0x200;
      if (*(char *)(*(long *)(*(long *)(field + 0x10) + 0x78) + 0x9a) == '\0') {
        uVar7 = uVar6;
      }
    }
  }
  if (((byte)field[1] & 0x60) != 0x40) {
    JVar3 = GetJavaType(field);
    if (JVar3 != JAVATYPE_MESSAGE) goto LAB_00296205;
    pDVar5 = FieldDescriptor::message_type(field);
    bVar1 = HasRequiredFields(pDVar5);
    if (!bVar1) goto LAB_00296205;
  }
  uVar7 = uVar7 | 0x400;
LAB_00296205:
  bVar1 = HasHasbit(field);
  uVar6 = uVar7 + 0x1000;
  if (!bVar1) {
    uVar6 = uVar7;
  }
  bVar1 = FieldDescriptor::is_map(field);
  if (bVar1) {
    if (*(char *)(*(long *)(field + 0x10) + 0x3a) != '\x03') {
      pDVar5 = FieldDescriptor::message_type(field);
      std::__cxx11::string::string((string *)&local_38,"value",&local_39);
      field_00 = Descriptor::FindFieldByName(pDVar5,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      JVar3 = GetJavaType(field_00);
      if (JVar3 == JAVATYPE_ENUM) {
        uVar6 = uVar6 | 0x800;
      }
    }
    uVar6 = uVar6 | 0x32;
  }
  else {
    bVar1 = FieldDescriptor::is_packed(field);
    if (bVar1) {
      iVar4 = GetExperimentalJavaFieldTypeForPacked(field);
      return iVar4;
    }
    if ((~(byte)field[1] & 0x60) == 0) {
      uVar7 = GetExperimentalJavaFieldTypeForRepeated(field);
    }
    else {
      bVar1 = IsRealOneof(field);
      uVar7 = GetExperimentalJavaFieldTypeForSingular(field);
      if (bVar1) {
        uVar7 = uVar7 + 0x33;
      }
    }
    uVar6 = uVar6 | uVar7;
  }
  return uVar6;
}

Assistant:

int GetExperimentalJavaFieldType(const FieldDescriptor* field) {
  static const int kMapFieldType = 50;
  static const int kOneofFieldTypeOffset = 51;
  static const int kRequiredBit = 0x100;
  static const int kUtf8CheckBit = 0x200;
  static const int kCheckInitialized = 0x400;
  static const int kMapWithProto2EnumValue = 0x800;
  static const int kHasHasBit = 0x1000;
  int extra_bits = field->is_required() ? kRequiredBit : 0;
  if (field->type() == FieldDescriptor::TYPE_STRING && CheckUtf8(field)) {
    extra_bits |= kUtf8CheckBit;
  }
  if (field->is_required() || (GetJavaType(field) == JAVATYPE_MESSAGE &&
                               HasRequiredFields(field->message_type()))) {
    extra_bits |= kCheckInitialized;
  }
  if (HasHasbit(field)) {
    extra_bits |= kHasHasBit;
  }

  if (field->is_map()) {
    if (!SupportUnknownEnumValue(field)) {
      const FieldDescriptor* value =
          field->message_type()->FindFieldByName("value");
      if (GetJavaType(value) == JAVATYPE_ENUM) {
        extra_bits |= kMapWithProto2EnumValue;
      }
    }
    return kMapFieldType | extra_bits;
  } else if (field->is_packed()) {
    return GetExperimentalJavaFieldTypeForPacked(field);
  } else if (field->is_repeated()) {
    return GetExperimentalJavaFieldTypeForRepeated(field) | extra_bits;
  } else if (IsRealOneof(field)) {
    return (GetExperimentalJavaFieldTypeForSingular(field) +
            kOneofFieldTypeOffset) |
           extra_bits;
  } else {
    return GetExperimentalJavaFieldTypeForSingular(field) | extra_bits;
  }
}